

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O1

QPolygonF * __thiscall
QPainterPath::toFillPolygon(QPolygonF *__return_storage_ptr__,QPainterPath *this,QTransform *matrix)

{
  QPointF *pQVar1;
  long lVar2;
  bool bVar3;
  undefined1 *puVar4;
  long lVar5;
  long in_FS_OFFSET;
  QPointF local_58;
  QArrayDataPointer<QPolygonF> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QPolygonF *)&DAT_aaaaaaaaaaaaaaaa;
  toSubpathPolygons((QList<QPolygonF> *)&local_48,this,matrix);
  (__return_storage_ptr__->super_QList<QPointF>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<QPointF>).d.ptr = (QPointF *)0x0;
  (__return_storage_ptr__->super_QList<QPointF>).d.size = 0;
  if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
    pQVar1 = ((local_48.ptr)->super_QList<QPointF>).d.ptr;
    local_58.xp = pQVar1->xp;
    local_58.yp = pQVar1->yp;
    if ((undefined1 *)local_48.size != (undefined1 *)0x0) {
      lVar5 = 0;
      puVar4 = (undefined1 *)0x0;
      do {
        pQVar1 = *(QPointF **)((long)&((local_48.ptr)->super_QList<QPointF>).d.ptr + lVar5);
        QtPrivate::QCommonArrayOps<QPointF>::growAppend
                  ((QCommonArrayOps<QPointF> *)__return_storage_ptr__,pQVar1,
                   pQVar1 + *(long *)((long)&((local_48.ptr)->super_QList<QPointF>).d.size + lVar5))
        ;
        lVar2 = *(long *)((long)&((local_48.ptr)->super_QList<QPointF>).d.size + lVar5);
        if (lVar2 == 0) {
LAB_003ea638:
          QtPrivate::QPodArrayOps<QPointF>::emplace<QPointF_const&>
                    ((QPodArrayOps<QPointF> *)__return_storage_ptr__,
                     (__return_storage_ptr__->super_QList<QPointF>).d.size,
                     *(QPointF **)((long)&((local_48.ptr)->super_QList<QPointF>).d.ptr + lVar5));
          QList<QPointF>::end(&__return_storage_ptr__->super_QList<QPointF>);
        }
        else {
          pQVar1 = *(QPointF **)((long)&((local_48.ptr)->super_QList<QPointF>).d.ptr + lVar5);
          bVar3 = qFuzzyCompare(pQVar1,pQVar1 + lVar2 + -1);
          if (!bVar3) goto LAB_003ea638;
        }
        if (lVar5 != 0) {
          QtPrivate::QPodArrayOps<QPointF>::emplace<QPointF_const&>
                    ((QPodArrayOps<QPointF> *)__return_storage_ptr__,
                     (__return_storage_ptr__->super_QList<QPointF>).d.size,&local_58);
          QList<QPointF>::end(&__return_storage_ptr__->super_QList<QPointF>);
        }
        puVar4 = puVar4 + 1;
        lVar5 = lVar5 + 0x18;
      } while (puVar4 < (ulong)local_48.size);
    }
  }
  QArrayDataPointer<QPolygonF>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF QPainterPath::toFillPolygon(const QTransform &matrix) const
{
    const QList<QPolygonF> flats = toSubpathPolygons(matrix);
    QPolygonF polygon;
    if (flats.isEmpty())
        return polygon;
    QPointF first = flats.first().first();
    for (int i=0; i<flats.size(); ++i) {
        polygon += flats.at(i);
        if (!flats.at(i).isClosed())
            polygon += flats.at(i).first();
        if (i > 0)
            polygon += first;
    }
    return polygon;
}